

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_grid_compact_cell_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_GLOB *nnode_global,REF_LONG *ncell_global,
          REF_GLOB **l2c)

{
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_MPI pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  uint uVar6;
  REF_GLOB *pRVar7;
  void *array;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  char *pcVar12;
  int cell;
  int iVar13;
  long lVar14;
  int local_cc;
  REF_INT nnode;
  REF_INT part;
  long *local_c0;
  REF_MPI local_b8;
  long *local_b0;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  lVar14 = (long)ref_node->max;
  local_c0 = ncell_global;
  if (lVar14 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1ed,
           "ref_grid_compact_cell_nodes","malloc *l2c of REF_GLOB negative");
    uVar5 = 1;
  }
  else {
    pRVar3 = ref_grid->mpi;
    pRVar7 = (REF_GLOB *)malloc(lVar14 * 8);
    *l2c = pRVar7;
    if (pRVar7 == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1ed,
             "ref_grid_compact_cell_nodes","malloc *l2c of REF_GLOB NULL");
      uVar5 = 2;
    }
    else {
      for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
        pRVar7[lVar8] = -1;
      }
      *nnode_global = 0;
      *local_c0 = 0;
      nnode = 0;
      iVar13 = 0;
      local_cc = 0;
      local_b8 = pRVar3;
      local_b0 = nnode_global;
      for (cell = 0; pRVar3 = local_b8, cell < ref_cell->max; cell = cell + 1) {
        RVar4 = ref_cell_nodes(ref_cell,cell,nodes);
        if (RVar4 == 0) {
          uVar5 = ref_cell_part(ref_cell,ref_node,cell,&part);
          if (uVar5 != 0) {
            pcVar12 = "part";
            uVar11 = 0x1f5;
            goto LAB_00137539;
          }
          iVar1 = local_b8->id;
          uVar9 = (ulong)(uint)ref_cell->node_per;
          if (ref_cell->node_per < 1) {
            uVar9 = 0;
          }
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            iVar2 = nodes[uVar10];
            if ((ref_node->ref_mpi->id == ref_node->part[iVar2]) && ((*l2c)[iVar2] == -1)) {
              (*l2c)[iVar2] = (long)iVar13;
              iVar13 = iVar13 + 1;
              nnode = iVar13;
            }
          }
          local_cc = local_cc + (uint)(iVar1 == part);
        }
      }
      *local_c0 = (long)local_cc;
      uVar5 = 1;
      uVar6 = ref_mpi_allsum(local_b8,local_c0,1,2);
      if (uVar6 == 0) {
        if ((long)pRVar3->n < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x204,"ref_grid_compact_cell_nodes","malloc counts of REF_INT negative");
        }
        else {
          array = malloc((long)pRVar3->n << 2);
          if (array == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x204,"ref_grid_compact_cell_nodes","malloc counts of REF_INT NULL");
            uVar5 = 2;
          }
          else {
            uVar5 = ref_mpi_allgather(pRVar3,&nnode,array,1);
            if (uVar5 == 0) {
              uVar10 = 0;
              uVar9 = (ulong)(uint)pRVar3->id;
              if (pRVar3->id < 1) {
                uVar9 = uVar10;
              }
              lVar14 = 0;
              for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
                lVar14 = lVar14 + *(int *)((long)array + uVar10 * 4);
              }
              uVar10 = 0;
              uVar9 = (ulong)(uint)pRVar3->n;
              if (pRVar3->n < 1) {
                uVar9 = uVar10;
              }
              for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
                *local_b0 = *local_b0 + (long)*(int *)((long)array + uVar10 * 4);
              }
              free(array);
              uVar10 = 0;
              uVar9 = (ulong)(uint)ref_node->max;
              if (ref_node->max < 1) {
                uVar9 = uVar10;
              }
              pRVar7 = *l2c;
              for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
                if (pRVar7[uVar10] != -1) {
                  pRVar7[uVar10] = pRVar7[uVar10] + lVar14;
                }
              }
              uVar5 = ref_node_ghost_glob(ref_node,pRVar7,1);
              if (uVar5 == 0) {
                return 0;
              }
              pcVar12 = "xfer";
              uVar11 = 0x213;
            }
            else {
              pcVar12 = "gather size";
              uVar11 = 0x205;
            }
LAB_00137539:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   uVar11,"ref_grid_compact_cell_nodes",(ulong)uVar5,pcVar12);
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x202,"ref_grid_compact_cell_nodes",(ulong)uVar6,"allsum");
        uVar5 = uVar6;
      }
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_cell_nodes(REF_GRID ref_grid,
                                               REF_CELL ref_cell,
                                               REF_GLOB *nnode_global,
                                               REF_LONG *ncell_global,
                                               REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_GLOB offset;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell++;
    }
    each_ref_cell_cell_node(ref_cell, cell_node) {
      if (ref_node_owned(ref_node, nodes[cell_node]) &&
          (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
        (*l2c)[nodes[cell_node]] = nnode;
        nnode++;
      }
    }
  }
  (*ncell_global) = ncell;
  RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += counts[proc];
  }
  each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }